

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O3

QRgbaFloat32 *
fetchARGBPMToRGBA32F<(QImage::Format)6>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  uint uVar2;
  uint6 uVar3;
  long lVar4;
  
  if (0 < count) {
    lVar4 = 0;
    do {
      uVar2 = *(uint *)(src + lVar4 + (long)index * 4);
      uVar3 = (uint6)CONCAT14((char)(uVar2 >> 0x18),uVar2) & 0xffff000000ff;
      pfVar1 = &buffer->r + lVar4;
      *pfVar1 = (float)(uVar2 >> 0x10 & 0xff) * 0.003921569;
      pfVar1[1] = (float)(uVar2 >> 8 & 0xff) * 0.003921569;
      pfVar1[2] = (float)(int)uVar3 * 0.003921569;
      pfVar1[3] = (float)(ushort)(uVar3 >> 0x20) * 0.003921569;
      lVar4 = lVar4 + 4;
    } while ((ulong)(uint)count << 2 != lVar4);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBPMToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                        const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i));
    return buffer;
}